

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

void QtPrivate::q_uninitialized_relocate_n<QGles2UniformDescription,long_long>
               (QGles2UniformDescription *first,longlong n,QGles2UniformDescription *out)

{
  void *in_RDX;
  long in_RSI;
  void *in_RDI;
  
  if (in_RSI != 0) {
    memcpy(in_RDX,in_RDI,in_RSI * 0x18);
  }
  return;
}

Assistant:

void q_uninitialized_relocate_n(T* first, N n, T* out)
{
    if constexpr (QTypeInfo<T>::isRelocatable) {
        static_assert(std::is_copy_constructible_v<T> || std::is_move_constructible_v<T>,
                      "Refusing to relocate this non-copy/non-move-constructible type.");
        if (n != N(0)) { // even if N == 0, out == nullptr or first == nullptr are UB for memcpy()
            std::memcpy(static_cast<void *>(out),
                        static_cast<const void *>(first),
                        n * sizeof(T));
        }
    } else {
        q_uninitialized_move_if_noexcept_n(first, n, out);
        if constexpr (QTypeInfo<T>::isComplex)
            std::destroy_n(first, n);
    }
}